

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

void soul::SourceCodeUtilities::iterateSyntaxTokens
               (CodeLocation *start,
               function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *handleToken)

{
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  string_view __x;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  AbortCompilationException *anon_var_0;
  char *local_138;
  size_t sStack_130;
  size_t local_128;
  size_t sStack_120;
  undefined1 auStack_118 [8];
  string_view tokenText;
  string_view newType;
  UTF8Reader newPos;
  undefined1 auStack_c0 [8];
  string_view currentTokenType;
  UTF8Reader local_a0;
  UTF8Reader currentSectionStart;
  SimpleTokeniser tokeniser;
  anon_class_1_0_00000001 getTokenType;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *handleToken_local;
  CodeLocation *start_local;
  
  SimpleTokeniser::SimpleTokeniser((SimpleTokeniser *)&currentSectionStart,start,false);
  UTF8Reader::UTF8Reader(&local_a0,&start->location);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c0);
  while (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            *)&currentSectionStart,(TokenType)"$eof"), ((bVar1 ^ 0xffU) & 1) != 0) {
    UTF8Reader::UTF8Reader
              ((UTF8Reader *)&newType._M_str,(UTF8Reader *)&tokeniser.super_SOULTokeniser.location);
    __x = iterateSyntaxTokens::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     ((long)&tokeniser.super_SOULTokeniser.literalType.text + 7),
                     (TokenType)tokeniser.super_SOULTokeniser.location.location.data);
    newType._M_len = (size_t)__x._M_str;
    tokenText._M_str = (char *)auStack_c0;
    __y._M_str = (char *)currentTokenType._M_len;
    __y._M_len = (size_t)auStack_c0;
    bVar1 = std::operator!=(__x,__y);
    if (bVar1) {
      pcVar4 = UTF8Reader::getAddress(&local_a0);
      pcVar2 = UTF8Reader::getAddress((UTF8Reader *)&newType._M_str);
      pcVar3 = UTF8Reader::getAddress(&local_a0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_118,pcVar4,
                 (long)pcVar2 - (long)pcVar3);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_118);
      if (!bVar1) {
        local_128 = (size_t)auStack_118;
        sStack_120 = tokenText._M_len;
        local_138 = (char *)auStack_c0;
        sStack_130 = currentTokenType._M_len;
        __args._M_str = (char *)tokenText._M_len;
        __args._M_len = (size_t)auStack_118;
        __args_1_00._M_str = (char *)currentTokenType._M_len;
        __args_1_00._M_len = (size_t)auStack_c0;
        bVar1 = std::
                function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                ::operator()(handleToken,__args,__args_1_00);
        if (!bVar1) break;
      }
      UTF8Reader::operator=(&local_a0,(UTF8Reader *)&newType._M_str);
      currentTokenType._M_len = newType._M_len;
      auStack_c0 = (undefined1  [8])__x._M_len;
    }
    anon_var_0 = (AbortCompilationException *)
                 Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::skip((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                         *)&currentSectionStart);
  }
  bVar1 = UTF8Reader::isNotEmpty(&local_a0);
  if (bVar1) {
    pcVar4 = UTF8Reader::getAddress(&local_a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,pcVar4);
    __args_1._M_str = (char *)currentTokenType._M_len;
    __args_1._M_len = (size_t)auStack_c0;
    std::
    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(handleToken,local_158,__args_1);
  }
  SimpleTokeniser::~SimpleTokeniser((SimpleTokeniser *)&currentSectionStart);
  return;
}

Assistant:

void SourceCodeUtilities::iterateSyntaxTokens (CodeLocation start,
                                               const std::function<bool(std::string_view, std::string_view)>& handleToken)
{
    auto getTokenType = [] (TokenType t) -> std::string_view
    {
       #define SOUL_COMPARE_KEYWORD(name, str) if (t == Keyword::name) return "hljs-keyword";
        SOUL_KEYWORDS (SOUL_COMPARE_KEYWORD)
       #undef SOUL_COMPARE_KEYWORD

       #define SOUL_COMPARE_OPERATOR(name, str) if (t == Operator::name) return "hljs-operator";
        SOUL_OPERATORS (SOUL_COMPARE_OPERATOR)
       #undef SOUL_COMPARE_OPERATOR

        if (t == Token::identifier)      return "hljs-name";
        if (t == Token::literalInt32)    return "hljs-number";
        if (t == Token::literalInt64)    return "hljs-number";
        if (t == Token::literalFloat32)  return "hljs-number";
        if (t == Token::literalFloat64)  return "hljs-number";
        if (t == Token::literalImag32)   return "hljs-number";
        if (t == Token::literalImag64)   return "hljs-number";
        if (t == Token::literalString)   return "hljs-string";
        if (t == Token::comment)         return "hljs-comment";

        return "hljs";
    };

    SimpleTokeniser tokeniser (start, false);
    auto currentSectionStart = start.location;
    std::string_view currentTokenType;

    try
    {
        while (! tokeniser.matches (Token::eof))
        {
            auto newPos = tokeniser.location.location;
            auto newType = getTokenType (tokeniser.currentType);

            if (newType != currentTokenType)
            {
                std::string_view tokenText (currentSectionStart.getAddress(),
                                            static_cast<size_t> (newPos.getAddress() - currentSectionStart.getAddress()));

                if (! tokenText.empty())
                    if (! handleToken (tokenText, currentTokenType))
                        break;

                currentSectionStart = newPos;
                currentTokenType = newType;
            }

            tokeniser.skip();
        }
    }
    catch (const AbortCompilationException&) {}

    if (currentSectionStart.isNotEmpty())
        handleToken (currentSectionStart.getAddress(), currentTokenType);
}